

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedStoragesList.hpp
# Opt level: O1

void __thiscall
supermap::
SortedStoragesList<supermap::KeyValue<char,_char>,_char,_void,_char,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>
::SortedStoragesList
          (SortedStoragesList<supermap::KeyValue<char,_char>,_char,_void,_char,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>
           *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  (this->super_Findable<supermap::KeyValue<char,_char>,_char>)._vptr_Findable =
       (_func_int **)&PTR___cxa_pure_virtual_00203660;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_manager;
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_char,_void>
  ::OrderedStorage(&this->
                    super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_char,_void>
                   ,(InnerRegisterSupplier *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  (this->super_Findable<supermap::KeyValue<char,_char>,_char>)._vptr_Findable =
       (_func_int **)&PTR___cxa_pure_virtual_00203938;
  (this->
  super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_char,_void>
  )._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00203960;
  return;
}

Assistant:

SortedStoragesList()
        : OrderedStorage<SortedStorage, IndexT, void>([]() { return std::make_unique<StoragesRegister>(); }) {}